

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O1

int write_file(char *path,char *value)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  
  iVar1 = open(path,0x41,0x192);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
  }
  else {
    sVar2 = strlen(value);
    do {
      sVar3 = write(iVar1,value,(long)(int)sVar2);
      if (-1 < (int)sVar3) {
        close(iVar1);
        return 0;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    close(iVar1);
    iVar1 = *piVar4;
  }
  return -iVar1;
}

Assistant:

static int write_file(const char *path, const char *value)
{
    int fd, ret, len;

    fd = open(path, O_WRONLY|O_CREAT, 0622);

    if (fd < 0)
        return -errno;

    len = strlen(value);

    do {
        ret = write(fd, value, len);
    } while (ret < 0 && errno == EINTR);

    close(fd);
    if (ret < 0) {
        return -errno;
    } else {
        return 0;
    }
}